

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::GeometryHelper_Make_Arc2D
          (X3DImporter *this,float pStartAngle,float pEndAngle,float pRadius,size_t pNumSegments,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices)

{
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_00;
  reference __x;
  double dVar1;
  aiVector3D aVar2;
  float local_120;
  float local_114;
  _List_iterator<aiVector3t<float>_> local_f0;
  aiVector3D local_e8;
  value_type local_d8;
  float local_cc;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *plStack_c8;
  float tangle;
  size_t pi;
  float local_b8;
  float angle_step;
  float angle_full;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_30;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertices_local;
  size_t pNumSegments_local;
  float local_18;
  float pRadius_local;
  float pEndAngle_local;
  float pStartAngle_local;
  X3DImporter *this_local;
  
  local_30 = pVertices;
  pVertices_local = (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pNumSegments;
  pNumSegments_local._4_4_ = pRadius;
  local_18 = pEndAngle;
  pRadius_local = pStartAngle;
  _pEndAngle_local = this;
  if ((pStartAngle < -6.2831855) || (6.2831855 < pStartAngle)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"GeometryHelper_Make_Arc2D.pStartAngle",&local_51);
    Throw_ArgOutOfRange(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  if ((local_18 < -6.2831855) || (6.2831855 < local_18)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"GeometryHelper_Make_Arc2D.pEndAngle",&local_89);
    Throw_ArgOutOfRange(this,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  if (pNumSegments_local._4_4_ <= 0.0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&angle_full,"GeometryHelper_Make_Arc2D.pRadius",
               (allocator<char> *)((long)&angle_step + 3));
    Throw_ArgOutOfRange(this,(string *)&angle_full);
    std::__cxx11::string::~string((string *)&angle_full);
    std::allocator<char>::~allocator((allocator<char> *)((long)&angle_step + 3));
  }
  dVar1 = std::fabs((double)(ulong)(uint)(local_18 - pRadius_local));
  local_b8 = SUB84(dVar1,0);
  if ((6.2831855 < local_b8) || ((local_b8 == 0.0 && (!NAN(local_b8))))) {
    local_b8 = 6.2831855;
  }
  local_114 = (float)pVertices_local;
  pi._4_4_ = local_b8 / local_114;
  for (plStack_c8 = (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
      this_00 = local_30, plStack_c8 <= pVertices_local;
      plStack_c8 = (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   ((long)&(plStack_c8->
                           super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                           ._M_impl._M_node.super__List_node_base._M_next + 1)) {
    local_120 = (float)plStack_c8;
    local_cc = local_120 * pi._4_4_ + pRadius_local;
    aVar2 = GeometryHelper_Make_Point2D(this,local_cc,pNumSegments_local._4_4_);
    local_e8._0_8_ = aVar2._0_8_;
    local_d8.x = local_e8.x;
    local_d8.y = local_e8.y;
    local_e8.z = aVar2.z;
    local_d8.z = local_e8.z;
    local_e8 = aVar2;
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (this_00,&local_d8);
  }
  if ((local_b8 == 6.2831855) && (!NAN(local_b8))) {
    local_f0._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(local_30)
    ;
    __x = std::_List_iterator<aiVector3t<float>_>::operator*(&local_f0);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (this_00,__x);
  }
  return;
}

Assistant:

void X3DImporter::GeometryHelper_Make_Arc2D(const float pStartAngle, const float pEndAngle, const float pRadius, size_t pNumSegments,
												std::list<aiVector3D>& pVertices)
{
	// check argument values ranges.
    if ( ( pStartAngle < -AI_MATH_TWO_PI_F ) || ( pStartAngle > AI_MATH_TWO_PI_F ) )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Make_Arc2D.pStartAngle" );
    }
    if ( ( pEndAngle < -AI_MATH_TWO_PI_F ) || ( pEndAngle > AI_MATH_TWO_PI_F ) )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Make_Arc2D.pEndAngle" );
    }
    if ( pRadius <= 0 )
    {
        Throw_ArgOutOfRange( "GeometryHelper_Make_Arc2D.pRadius" );
    }

	// calculate arc angle and check type of arc
	float angle_full = std::fabs(pEndAngle - pStartAngle);
    if ( ( angle_full > AI_MATH_TWO_PI_F ) || ( angle_full == 0.0f ) )
    {
        angle_full = AI_MATH_TWO_PI_F;
    }

	// calculate angle for one step - angle to next point of line.
	float angle_step = angle_full / (float)pNumSegments;
	// make points
	for(size_t pi = 0; pi <= pNumSegments; pi++)
	{
		float tangle = pStartAngle + pi * angle_step;
		pVertices.push_back(GeometryHelper_Make_Point2D(tangle, pRadius));
	}// for(size_t pi = 0; pi <= pNumSegments; pi++)

	// if we making full circle then add last vertex equal to first vertex
	if(angle_full == AI_MATH_TWO_PI_F) pVertices.push_back(*pVertices.begin());
}